

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_root.c
# Opt level: O1

int arkRootInit(ARKodeMem ark_mem,int nrtfn,ARKRootFn g)

{
  uint uVar1;
  ARKodeRootMem pAVar2;
  long lVar3;
  realtype *__ptr;
  realtype *prVar4;
  int *piVar5;
  int *piVar6;
  ulong uVar7;
  char *module;
  char *msgfmt;
  size_t sVar8;
  uint uVar9;
  long lVar10;
  int iVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar17;
  
  if (ark_mem == (ARKodeMem)0x0) {
    module = "ARKode";
    msgfmt = "arkode_mem = NULL illegal.";
    iVar12 = -0x15;
    ark_mem = (ARKodeMem)0x0;
    iVar17 = -0x15;
    goto LAB_00414726;
  }
  uVar9 = 0;
  if (0 < nrtfn) {
    uVar9 = nrtfn;
  }
  if (ark_mem->root_mem == (ARKodeRootMem)0x0) {
    pAVar2 = (ARKodeRootMem)malloc(0x88);
    ark_mem->root_mem = pAVar2;
    if (pAVar2 == (ARKodeRootMem)0x0) {
      arkProcessError(ark_mem,0,"ARKode","arkRootInit","Allocation of arkode_mem failed.");
      return -0x14;
    }
    pAVar2->gfun = (ARKRootFn)0x0;
    pAVar2->nrtfn = 0;
    pAVar2->irfnd = 0;
    pAVar2->gactive = (int *)0x0;
    pAVar2->iroots = (int *)0x0;
    pAVar2->rootdir = (int *)0x0;
    pAVar2->glo = (realtype *)0x0;
    pAVar2->ghi = (realtype *)0x0;
    pAVar2->grout = (realtype *)0x0;
    pAVar2->mxgnull = 1;
    pAVar2->root_data = ark_mem->user_data;
    ark_mem->lrw = ark_mem->lrw + 5;
    ark_mem->liw = ark_mem->liw + 0xc;
  }
  uVar1 = ark_mem->root_mem->nrtfn;
  if (0 < (int)uVar1 && uVar9 != uVar1) {
    free(ark_mem->root_mem->glo);
    pAVar2 = ark_mem->root_mem;
    pAVar2->glo = (realtype *)0x0;
    free(pAVar2->ghi);
    pAVar2 = ark_mem->root_mem;
    pAVar2->ghi = (realtype *)0x0;
    free(pAVar2->grout);
    pAVar2 = ark_mem->root_mem;
    pAVar2->grout = (realtype *)0x0;
    free(pAVar2->iroots);
    pAVar2 = ark_mem->root_mem;
    pAVar2->iroots = (int *)0x0;
    free(pAVar2->rootdir);
    pAVar2 = ark_mem->root_mem;
    pAVar2->rootdir = (int *)0x0;
    free(pAVar2->gactive);
    pAVar2 = ark_mem->root_mem;
    pAVar2->gactive = (int *)0x0;
    lVar3 = (long)pAVar2->nrtfn;
    lVar10 = lVar3 * 3;
    auVar13._8_4_ = (int)lVar10;
    auVar13._0_8_ = lVar10;
    auVar13._12_4_ = (int)((ulong)lVar10 >> 0x20);
    ark_mem->lrw = ark_mem->lrw + lVar3 * -3;
    ark_mem->liw = ark_mem->liw - auVar13._8_8_;
  }
  pAVar2 = ark_mem->root_mem;
  if (nrtfn < 1) {
    pAVar2->nrtfn = 0;
    pAVar2->gfun = (ARKRootFn)0x0;
    return 0;
  }
  if (uVar9 == pAVar2->nrtfn) {
    if (pAVar2->gfun == g) {
      return 0;
    }
    if (g != (ARKRootFn)0x0) {
      pAVar2->gfun = g;
      return 0;
    }
    free(pAVar2->glo);
    pAVar2 = ark_mem->root_mem;
    pAVar2->glo = (realtype *)0x0;
    free(pAVar2->ghi);
    pAVar2 = ark_mem->root_mem;
    pAVar2->ghi = (realtype *)0x0;
    free(pAVar2->grout);
    pAVar2 = ark_mem->root_mem;
    pAVar2->grout = (realtype *)0x0;
    free(pAVar2->iroots);
    pAVar2 = ark_mem->root_mem;
    pAVar2->iroots = (int *)0x0;
    free(pAVar2->rootdir);
    pAVar2 = ark_mem->root_mem;
    pAVar2->rootdir = (int *)0x0;
    free(pAVar2->gactive);
    ark_mem->root_mem->gactive = (int *)0x0;
    ark_mem->lrw = ark_mem->lrw - (ulong)(uVar9 * 3);
    ark_mem->liw = ark_mem->liw - (ulong)(uVar9 * 3);
  }
  else {
    pAVar2->nrtfn = uVar9;
    if (g != (ARKRootFn)0x0) {
      pAVar2->gfun = g;
      pAVar2->glo = (realtype *)0x0;
      sVar8 = (ulong)uVar9 * 8;
      __ptr = (realtype *)malloc(sVar8);
      pAVar2->glo = __ptr;
      if (__ptr == (realtype *)0x0) {
LAB_00414704:
        module = "ARKode";
      }
      else {
        pAVar2->ghi = (realtype *)0x0;
        prVar4 = (realtype *)malloc(sVar8);
        pAVar2->ghi = prVar4;
        if (prVar4 == (realtype *)0x0) {
          free(__ptr);
          pAVar2->glo = (realtype *)0x0;
          goto LAB_00414704;
        }
        pAVar2->grout = (realtype *)0x0;
        prVar4 = (realtype *)malloc(sVar8);
        pAVar2->grout = prVar4;
        if (prVar4 == (realtype *)0x0) {
          free(__ptr);
          pAVar2->glo = (realtype *)0x0;
          free(pAVar2->ghi);
          ark_mem->root_mem->ghi = (realtype *)0x0;
          goto LAB_00414704;
        }
        pAVar2->iroots = (int *)0x0;
        sVar8 = (ulong)uVar9 << 2;
        piVar5 = (int *)malloc(sVar8);
        pAVar2->iroots = piVar5;
        if (piVar5 == (int *)0x0) {
          free(__ptr);
          pAVar2->glo = (realtype *)0x0;
          free(pAVar2->ghi);
          pAVar2 = ark_mem->root_mem;
          pAVar2->ghi = (realtype *)0x0;
          free(pAVar2->grout);
          ark_mem->root_mem->grout = (realtype *)0x0;
          goto LAB_00414704;
        }
        pAVar2->rootdir = (int *)0x0;
        piVar5 = (int *)malloc(sVar8);
        pAVar2->rootdir = piVar5;
        if (piVar5 == (int *)0x0) {
          free(__ptr);
          pAVar2->glo = (realtype *)0x0;
          free(pAVar2->ghi);
          pAVar2 = ark_mem->root_mem;
          pAVar2->ghi = (realtype *)0x0;
          free(pAVar2->grout);
          pAVar2 = ark_mem->root_mem;
          pAVar2->grout = (realtype *)0x0;
          free(pAVar2->iroots);
          ark_mem->root_mem->iroots = (int *)0x0;
          goto LAB_00414704;
        }
        pAVar2->gactive = (int *)0x0;
        piVar6 = (int *)malloc(sVar8);
        pAVar2->gactive = piVar6;
        if (piVar6 != (int *)0x0) {
          lVar10 = 0;
          memset(piVar5,0,(ulong)(uint)nrtfn << 2);
          auVar13 = _DAT_006979c0;
          uVar7 = 1;
          if (1 < nrtfn) {
            uVar7 = (ulong)(uint)nrtfn;
          }
          lVar3 = uVar7 - 1;
          auVar11._8_4_ = (int)lVar3;
          auVar11._0_8_ = lVar3;
          auVar11._12_4_ = (int)((ulong)lVar3 >> 0x20);
          auVar11 = auVar11 ^ _DAT_006979c0;
          auVar14 = _DAT_0069a7c0;
          auVar15 = _DAT_006979b0;
          do {
            auVar16 = auVar15 ^ auVar13;
            iVar12 = auVar11._4_4_;
            if ((bool)(~(auVar16._4_4_ == iVar12 && auVar11._0_4_ < auVar16._0_4_ ||
                        iVar12 < auVar16._4_4_) & 1)) {
              *(undefined4 *)((long)piVar6 + lVar10) = 1;
            }
            if ((auVar16._12_4_ != auVar11._12_4_ || auVar16._8_4_ <= auVar11._8_4_) &&
                auVar16._12_4_ <= auVar11._12_4_) {
              *(undefined4 *)((long)piVar6 + lVar10 + 4) = 1;
            }
            auVar16 = auVar14 ^ auVar13;
            iVar17 = auVar16._4_4_;
            if (iVar17 <= iVar12 && (iVar17 != iVar12 || auVar16._0_4_ <= auVar11._0_4_)) {
              *(undefined4 *)((long)piVar6 + lVar10 + 8) = 1;
              *(undefined4 *)((long)piVar6 + lVar10 + 0xc) = 1;
            }
            lVar3 = auVar15._8_8_;
            auVar15._0_8_ = auVar15._0_8_ + 4;
            auVar15._8_8_ = lVar3 + 4;
            lVar3 = auVar14._8_8_;
            auVar14._0_8_ = auVar14._0_8_ + 4;
            auVar14._8_8_ = lVar3 + 4;
            lVar10 = lVar10 + 0x10;
          } while ((ulong)((int)uVar7 + 3U & 0xfffffffc) << 2 != lVar10);
          ark_mem->lrw = (ulong)(uVar9 * 3) + ark_mem->lrw;
          ark_mem->liw = (ulong)(uVar9 * 3) + ark_mem->liw;
          return 0;
        }
        free(__ptr);
        pAVar2->glo = (realtype *)0x0;
        free(pAVar2->ghi);
        pAVar2 = ark_mem->root_mem;
        pAVar2->ghi = (realtype *)0x0;
        free(pAVar2->grout);
        pAVar2 = ark_mem->root_mem;
        pAVar2->grout = (realtype *)0x0;
        free(pAVar2->iroots);
        pAVar2 = ark_mem->root_mem;
        pAVar2->iroots = (int *)0x0;
        free(pAVar2->rootdir);
        ark_mem->root_mem->rootdir = (int *)0x0;
        module = "ARKodeS";
      }
      msgfmt = "A memory request failed.";
      iVar12 = -0x14;
      iVar17 = -0x14;
      goto LAB_00414726;
    }
  }
  module = "ARKode";
  msgfmt = "g = NULL illegal.";
  iVar12 = -0x16;
  iVar17 = -0x16;
LAB_00414726:
  arkProcessError(ark_mem,iVar17,module,"arkRootInit",msgfmt);
  return iVar12;
}

Assistant:

int arkRootInit(ARKodeMem ark_mem, int nrtfn, ARKRootFn g)
{
  int i, nrt;

  /* Check ark_mem pointer */
  if (ark_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkRootInit", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  nrt = (nrtfn < 0) ? 0 : nrtfn;

  /* If unallocated, allocate rootfinding structure, set defaults, update space */
  if (ark_mem->root_mem == NULL) {
    ark_mem->root_mem = (ARKodeRootMem) malloc(sizeof(struct ARKodeRootMemRec));
    if (ark_mem->root_mem == NULL) {
      arkProcessError(ark_mem, 0, "ARKode", "arkRootInit",
                      MSG_ARK_ARKMEM_FAIL);
      return(ARK_MEM_FAIL);
    }
    ark_mem->root_mem->glo       = NULL;
    ark_mem->root_mem->ghi       = NULL;
    ark_mem->root_mem->grout     = NULL;
    ark_mem->root_mem->iroots    = NULL;
    ark_mem->root_mem->rootdir   = NULL;
    ark_mem->root_mem->gfun      = NULL;
    ark_mem->root_mem->nrtfn     = 0;
    ark_mem->root_mem->irfnd     = 0;
    ark_mem->root_mem->gactive   = NULL;
    ark_mem->root_mem->mxgnull   = 1;
    ark_mem->root_mem->root_data = ark_mem->user_data;

    ark_mem->lrw += ARK_ROOT_LRW;
    ark_mem->liw += ARK_ROOT_LIW;
  }

  /* If rerunning arkRootInit() with a different number of root
     functions (changing number of gfun components), then free
     currently held memory resources */
  if ((nrt != ark_mem->root_mem->nrtfn) && (ark_mem->root_mem->nrtfn > 0)) {
    free(ark_mem->root_mem->glo);     ark_mem->root_mem->glo     = NULL;
    free(ark_mem->root_mem->ghi);     ark_mem->root_mem->ghi     = NULL;
    free(ark_mem->root_mem->grout);   ark_mem->root_mem->grout   = NULL;
    free(ark_mem->root_mem->iroots);  ark_mem->root_mem->iroots  = NULL;
    free(ark_mem->root_mem->rootdir); ark_mem->root_mem->rootdir = NULL;
    free(ark_mem->root_mem->gactive); ark_mem->root_mem->gactive = NULL;

    ark_mem->lrw -= 3 * (ark_mem->root_mem->nrtfn);
    ark_mem->liw -= 3 * (ark_mem->root_mem->nrtfn);
  }

  /* If arkRootInit() was called with nrtfn == 0, then set
     nrtfn to zero and gfun to NULL before returning */
  if (nrt == 0) {
    ark_mem->root_mem->nrtfn = nrt;
    ark_mem->root_mem->gfun = NULL;
    return(ARK_SUCCESS);
  }

  /* If rerunning arkRootInit() with the same number of root
     functions (not changing number of gfun components), then
     check if the root function argument has changed */
  /* If g != NULL then return as currently reserved memory
     resources will suffice */
  if (nrt == ark_mem->root_mem->nrtfn) {
    if (g != ark_mem->root_mem->gfun) {
      if (g == NULL) {
        free(ark_mem->root_mem->glo);     ark_mem->root_mem->glo     = NULL;
        free(ark_mem->root_mem->ghi);     ark_mem->root_mem->ghi     = NULL;
        free(ark_mem->root_mem->grout);   ark_mem->root_mem->grout   = NULL;
        free(ark_mem->root_mem->iroots);  ark_mem->root_mem->iroots  = NULL;
        free(ark_mem->root_mem->rootdir); ark_mem->root_mem->rootdir = NULL;
        free(ark_mem->root_mem->gactive); ark_mem->root_mem->gactive = NULL;

        ark_mem->lrw -= 3*nrt;
        ark_mem->liw -= 3*nrt;

        arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                        "arkRootInit", MSG_ARK_NULL_G);
        return(ARK_ILL_INPUT);
      }
      else {
        ark_mem->root_mem->gfun = g;
        return(ARK_SUCCESS);
      }
    }
    else return(ARK_SUCCESS);
  }

  /* Set variable values in ARKode memory block */
  ark_mem->root_mem->nrtfn = nrt;
  if (g == NULL) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkRootInit", MSG_ARK_NULL_G);
    return(ARK_ILL_INPUT);
  }
  else ark_mem->root_mem->gfun = g;

  /* Allocate necessary memory and return */
  ark_mem->root_mem->glo = NULL;
  ark_mem->root_mem->glo = (realtype *) malloc(nrt*sizeof(realtype));
  if (ark_mem->root_mem->glo == NULL) {
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                    "arkRootInit", MSG_ARK_MEM_FAIL);
    return(ARK_MEM_FAIL);
  }
  ark_mem->root_mem->ghi = NULL;
  ark_mem->root_mem->ghi = (realtype *) malloc(nrt*sizeof(realtype));
  if (ark_mem->root_mem->ghi == NULL) {
    free(ark_mem->root_mem->glo); ark_mem->root_mem->glo = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                    "arkRootInit", MSG_ARK_MEM_FAIL);
    return(ARK_MEM_FAIL);
  }
  ark_mem->root_mem->grout = NULL;
  ark_mem->root_mem->grout = (realtype *) malloc(nrt*sizeof(realtype));
  if (ark_mem->root_mem->grout == NULL) {
    free(ark_mem->root_mem->glo); ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi); ark_mem->root_mem->ghi = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                    "arkRootInit", MSG_ARK_MEM_FAIL);
    return(ARK_MEM_FAIL);
  }
  ark_mem->root_mem->iroots = NULL;
  ark_mem->root_mem->iroots = (int *) malloc(nrt*sizeof(int));
  if (ark_mem->root_mem->iroots == NULL) {
    free(ark_mem->root_mem->glo); ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi); ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout); ark_mem->root_mem->grout = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                    "arkRootInit", MSG_ARK_MEM_FAIL);
    return(ARK_MEM_FAIL);
  }
  ark_mem->root_mem->rootdir = NULL;
  ark_mem->root_mem->rootdir = (int *) malloc(nrt*sizeof(int));
  if (ark_mem->root_mem->rootdir == NULL) {
    free(ark_mem->root_mem->glo); ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi); ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout); ark_mem->root_mem->grout = NULL;
    free(ark_mem->root_mem->iroots); ark_mem->root_mem->iroots = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode",
                    "arkRootInit", MSG_ARK_MEM_FAIL);
    return(ARK_MEM_FAIL);
  }
  ark_mem->root_mem->gactive = NULL;
  ark_mem->root_mem->gactive = (booleantype *) malloc(nrt*sizeof(booleantype));
  if (ark_mem->root_mem->gactive == NULL) {
    free(ark_mem->root_mem->glo); ark_mem->root_mem->glo = NULL;
    free(ark_mem->root_mem->ghi); ark_mem->root_mem->ghi = NULL;
    free(ark_mem->root_mem->grout); ark_mem->root_mem->grout = NULL;
    free(ark_mem->root_mem->iroots); ark_mem->root_mem->iroots = NULL;
    free(ark_mem->root_mem->rootdir); ark_mem->root_mem->rootdir = NULL;
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKodeS",
                    "arkRootInit", MSG_ARK_MEM_FAIL);
    return(ARK_MEM_FAIL);
  }

  /* Set default values for rootdir (both directions) */
  for(i=0; i<nrt; i++) ark_mem->root_mem->rootdir[i] = 0;

  /* Set default values for gactive (all active) */
  for(i=0; i<nrt; i++) ark_mem->root_mem->gactive[i] = SUNTRUE;

  ark_mem->lrw += 3*nrt;
  ark_mem->liw += 3*nrt;

  return(ARK_SUCCESS);
}